

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  float *pfVar9;
  int iVar10;
  Mat rgb_channels;
  Mat local_70;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    if ((short)type != 4) {
      if ((type & 0xffffU) != 3) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar2 = 0;
      iVar10 = 0;
      if (0 < h) {
        iVar10 = h;
      }
      iVar3 = 1;
      if (stride - w == 0) {
        iVar10 = 1;
        iVar3 = h;
      }
      pbVar8 = pixels;
      for (; iVar6 = iVar3 * w, iVar2 != iVar10; iVar2 = iVar2 + 1) {
        for (; 0 < iVar6; iVar6 = iVar6 + -1) {
          *pfVar1 = (float)*pbVar8;
          pbVar8 = pbVar8 + 1;
          pfVar1 = pfVar1 + 1;
        }
        pbVar8 = pbVar8 + (stride - w);
      }
      if (type != 4) {
        return __return_storage_ptr__;
      }
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if (pfVar1 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar10 = 0;
    if (0 < h) {
      iVar10 = h;
    }
    iVar2 = stride + w * -4;
    if (iVar2 != 0) {
      h = 1;
    }
    rgb_channels.w = __return_storage_ptr__->w;
    rgb_channels.h = __return_storage_ptr__->h;
    rgb_channels.elemsize = __return_storage_ptr__->elemsize;
    rgb_channels.refcount = (int *)0x0;
    rgb_channels.elempack = __return_storage_ptr__->elempack;
    rgb_channels.allocator = __return_storage_ptr__->allocator;
    rgb_channels.dims = 2;
    rgb_channels.c = 1;
    rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
    rgb_channels.data = pfVar1;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar9 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    pfVar5 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,3);
    pfVar4 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar10 = 1;
    }
    for (iVar3 = 0; iVar6 = h * w, iVar3 != iVar10; iVar3 = iVar3 + 1) {
      for (; 0 < iVar6; iVar6 = iVar6 + -1) {
        *pfVar1 = (float)*pixels;
        *pfVar9 = (float)pixels[1];
        *pfVar5 = (float)pixels[2];
        *pfVar4 = (float)pixels[3];
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar9 = pfVar9 + 1;
        pfVar5 = pfVar5 + 1;
        pfVar4 = pfVar4 + 1;
      }
      pixels = pixels + iVar2;
    }
    return __return_storage_ptr__;
  }
  if (type == 0x10002) {
LAB_00117e4d:
    from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  }
  if (type == 0x10003) {
LAB_00117e6c:
    from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
  }
  else {
    if (type == 0x10004) {
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = 0;
      if (0 < h) {
        iVar10 = h;
      }
      iVar2 = stride + w * -4;
      if (iVar2 != 0) {
        h = 1;
      }
      rgb_channels.w = __return_storage_ptr__->w;
      rgb_channels.h = __return_storage_ptr__->h;
      rgb_channels.elemsize = __return_storage_ptr__->elemsize;
      rgb_channels.refcount = (int *)0x0;
      rgb_channels.elempack = __return_storage_ptr__->elempack;
      rgb_channels.allocator = __return_storage_ptr__->allocator;
      rgb_channels.dims = 2;
      rgb_channels.c = 1;
      rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
      rgb_channels.data = pfVar1;
      ~Mat(&rgb_channels);
      channel(&rgb_channels,__return_storage_ptr__,1);
      pfVar9 = (float *)rgb_channels.data;
      ~Mat(&rgb_channels);
      channel(&rgb_channels,__return_storage_ptr__,2);
      pfVar5 = (float *)rgb_channels.data;
      ~Mat(&rgb_channels);
      if (stride == w * 4) {
        iVar10 = 1;
      }
      for (iVar3 = 0; iVar6 = h * w, iVar3 != iVar10; iVar3 = iVar3 + 1) {
        for (; 0 < iVar6; iVar6 = iVar6 + -1) {
          *pfVar1 = (float)*pixels;
          *pfVar9 = (float)pixels[1];
          *pfVar5 = (float)pixels[2];
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
          pfVar9 = pfVar9 + 1;
          pfVar5 = pfVar5 + 1;
        }
        pixels = pixels + iVar2;
      }
      return __return_storage_ptr__;
    }
    if (type == 0x40003) {
      create(__return_storage_ptr__,w,h,4,4,allocator);
      if (__return_storage_ptr__->data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      channel_range(&rgb_channels,__return_storage_ptr__,0,3);
      from_gray2rgb(pixels,w,h,stride,&rgb_channels,allocator);
      channel(&local_70,__return_storage_ptr__,3);
    }
    else {
      if (type == 0x20003) goto LAB_00117e6c;
      if (type == 0x20004) {
        create(__return_storage_ptr__,w,h,3,4,allocator);
        pfVar1 = (float *)__return_storage_ptr__->data;
        if (pfVar1 == (float *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        iVar10 = 0;
        if (0 < h) {
          iVar10 = h;
        }
        iVar2 = stride + w * -4;
        if (iVar2 != 0) {
          h = 1;
        }
        rgb_channels.w = __return_storage_ptr__->w;
        rgb_channels.h = __return_storage_ptr__->h;
        rgb_channels.elemsize = __return_storage_ptr__->elemsize;
        rgb_channels.refcount = (int *)0x0;
        rgb_channels.elempack = __return_storage_ptr__->elempack;
        rgb_channels.allocator = __return_storage_ptr__->allocator;
        rgb_channels.dims = 2;
        rgb_channels.c = 1;
        rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
        rgb_channels.data = pfVar1;
        ~Mat(&rgb_channels);
        channel(&rgb_channels,__return_storage_ptr__,1);
        pfVar9 = (float *)rgb_channels.data;
        ~Mat(&rgb_channels);
        channel(&rgb_channels,__return_storage_ptr__,2);
        pfVar5 = (float *)rgb_channels.data;
        ~Mat(&rgb_channels);
        if (stride == w * 4) {
          iVar10 = 1;
        }
        for (iVar3 = 0; iVar6 = h * w, iVar3 != iVar10; iVar3 = iVar3 + 1) {
          for (; 0 < iVar6; iVar6 = iVar6 + -1) {
            *pfVar1 = (float)pixels[2];
            *pfVar9 = (float)pixels[1];
            *pfVar5 = (float)*pixels;
            pixels = pixels + 4;
            pfVar1 = pfVar1 + 1;
            pfVar9 = pfVar9 + 1;
            pfVar5 = pfVar5 + 1;
          }
          pixels = pixels + iVar2;
        }
        return __return_storage_ptr__;
      }
      if (type == 0x30001) {
        iVar10 = 1;
        create(__return_storage_ptr__,w,h,1,4,allocator);
        pfVar1 = (float *)__return_storage_ptr__->data;
        if (pfVar1 == (float *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        iVar6 = w * -3 + stride;
        iVar3 = 0;
        iVar2 = 0;
        if (0 < h) {
          iVar2 = h;
        }
        if (iVar6 == 0) {
          iVar2 = iVar10;
          iVar10 = h;
        }
        for (; iVar7 = iVar10 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
          for (; 0 < iVar7; iVar7 = iVar7 + -1) {
            *pfVar1 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                             >> 8);
            pixels = pixels + 3;
            pfVar1 = pfVar1 + 1;
          }
          pixels = pixels + iVar6;
        }
        return __return_storage_ptr__;
      }
      if (type == 0x30002) {
        iVar10 = 1;
        create(__return_storage_ptr__,w,h,1,4,allocator);
        pfVar1 = (float *)__return_storage_ptr__->data;
        if (pfVar1 == (float *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        iVar6 = w * -3 + stride;
        iVar3 = 0;
        iVar2 = 0;
        if (0 < h) {
          iVar2 = h;
        }
        if (iVar6 == 0) {
          iVar2 = iVar10;
          iVar10 = h;
        }
        for (; iVar7 = iVar10 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
          for (; 0 < iVar7; iVar7 = iVar7 + -1) {
            *pfVar1 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                             >> 8);
            pixels = pixels + 3;
            pfVar1 = pfVar1 + 1;
          }
          pixels = pixels + iVar6;
        }
        return __return_storage_ptr__;
      }
      if (type == 0x30004) {
        iVar10 = 1;
        create(__return_storage_ptr__,w,h,1,4,allocator);
        pfVar1 = (float *)__return_storage_ptr__->data;
        if (pfVar1 == (float *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        iVar3 = 0;
        iVar2 = 0;
        if (0 < h) {
          iVar2 = h;
        }
        iVar6 = stride + w * -4;
        if (iVar6 == 0) {
          iVar2 = iVar10;
          iVar10 = h;
        }
        for (; iVar7 = iVar10 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
          for (; 0 < iVar7; iVar7 = iVar7 + -1) {
            *pfVar1 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                             >> 8);
            pixels = pixels + 4;
            pfVar1 = pfVar1 + 1;
          }
          pixels = pixels + iVar6;
        }
        return __return_storage_ptr__;
      }
      if (type == 0x40001) {
        create(__return_storage_ptr__,w,h,4,4,allocator);
        if (__return_storage_ptr__->data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        channel_range(&rgb_channels,__return_storage_ptr__,0,3);
        from_rgb(pixels,w,h,stride,&rgb_channels,allocator);
        channel(&local_70,__return_storage_ptr__,3);
      }
      else {
        if (type != 0x40002) {
          if (type != 0x20001) {
            return __return_storage_ptr__;
          }
          goto LAB_00117e4d;
        }
        create(__return_storage_ptr__,w,h,4,4,allocator);
        if (__return_storage_ptr__->data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        channel_range(&rgb_channels,__return_storage_ptr__,0,3);
        from_rgb2bgr(pixels,w,h,stride,&rgb_channels,allocator);
        channel(&local_70,__return_storage_ptr__,3);
      }
    }
    fill(&local_70,255.0);
    ~Mat(&local_70);
    ~Mat(&rgb_channels);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}